

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapDeepOcean(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int *piVar11;
  int *local_68;
  int *local_60;
  
  uVar8 = (ulong)(uint)h;
  iVar1 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar1 == 0) {
    lVar5 = (long)w;
    lVar7 = 0;
    if (0 < lVar5) {
      lVar7 = lVar5;
    }
    if (h < 1) {
      uVar8 = 0;
    }
    piVar11 = out + lVar5 + 4;
    local_60 = out + lVar5 * 2 + 5;
    uVar6 = 0;
    local_68 = out;
    while (uVar6 != uVar8) {
      uVar6 = uVar6 + 1;
      for (lVar9 = 0; lVar7 << 2 != lVar9; lVar9 = lVar9 + 4) {
        iVar1 = *(int *)((long)piVar11 + lVar9 + -4);
        iVar2 = isShallowOcean(iVar1);
        iVar4 = iVar1;
        if (iVar2 != 0) {
          iVar2 = isShallowOcean(*(int *)((long)out + lVar9 + 4));
          iVar3 = isShallowOcean(*(int *)((long)piVar11 + lVar9));
          uVar10 = (iVar2 != 0) + 1;
          if (iVar3 == 0) {
            uVar10 = (uint)(iVar2 != 0);
          }
          iVar2 = isShallowOcean(*(int *)((long)piVar11 + lVar9 + -8));
          iVar3 = isShallowOcean(*(int *)((long)local_60 + lVar9));
          if (3 < ((uVar10 - (iVar2 == 0)) + 2) - (uint)(iVar3 == 0)) {
            if (iVar1 == 0) {
              iVar4 = 0x18;
            }
            else if (iVar1 == 10) {
              iVar4 = 0x32;
            }
            else {
              iVar4 = 0x2f;
              if (iVar1 != 0x2c) {
                if (iVar1 == 0x2e) {
                  iVar4 = 0x31;
                }
                else if (iVar1 == 0x2d) {
                  iVar4 = 0x30;
                }
                else {
                  iVar4 = 0x18;
                }
              }
            }
          }
        }
        *(int *)((long)local_68 + lVar9) = iVar4;
      }
      local_68 = local_68 + lVar5;
      piVar11 = piVar11 + lVar5 + 2;
      local_60 = local_60 + lVar5 + 2;
      out = out + lVar5 + 2;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mapDeepOcean(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[(i+1) + (j+1)*pW];

            if (isShallowOcean(v11))
            {
                // count adjacent oceans
                int oceans = 0;
                if (isShallowOcean(out[(i+1) + (j+0)*pW])) oceans++;
                if (isShallowOcean(out[(i+2) + (j+1)*pW])) oceans++;
                if (isShallowOcean(out[(i+0) + (j+1)*pW])) oceans++;
                if (isShallowOcean(out[(i+1) + (j+2)*pW])) oceans++;

                if (oceans >= 4)
                {
                    switch (v11)
                    {
                    case warm_ocean:
                        v11 = deep_warm_ocean;
                        break;
                    case lukewarm_ocean:
                        v11 = deep_lukewarm_ocean;
                        break;
                    case ocean:
                        v11 = deep_ocean;
                        break;
                    case cold_ocean:
                        v11 = deep_cold_ocean;
                        break;
                    case frozen_ocean:
                        v11 = deep_frozen_ocean;
                        break;
                    default:
                        v11 = deep_ocean;
                    }
                }
            }

            out[i + j*w] = v11;
        }
    }

    return 0;
}